

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O2

bool __thiscall EnrichableI2cAnalyzer::GetBitPartTwo(EnrichableI2cAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  char cVar2;
  bool bVar3;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  bVar3 = true;
  while( true ) {
    pAVar1 = this->mSda;
    AnalyzerChannelData::GetSampleNumber();
    cVar2 = AnalyzerChannelData::WouldAdvancingToAbsPositionCauseTransition((ulonglong)pAVar1);
    if (cVar2 == '\0') break;
    AnalyzerChannelData::AdvanceToNextEdge();
    RecordStartStopBit(this);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EnrichableI2cAnalyzer::GetBitPartTwo()
{
	//the sda and scl should be synced up, and we are either on a stop/start condition (clock high) or we're on a regular bit( clock high).
	//we also should not expect any more start/stop conditions before the next falling edge, I beleive.

	//move to next falling edge.
	bool result = true;
	mScl->AdvanceToNextEdge();
	while( mSda->WouldAdvancingToAbsPositionCauseTransition( mScl->GetSampleNumber() - 1 ) == true )
	{
		//clock is high -- SDA changes indicate start, stop, etc.
		mSda->AdvanceToNextEdge();
		RecordStartStopBit();
		result = false;
	}
	return result;
}